

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

Dic<asl::String> __thiscall asl::String::split(String *this,String *sep1,String *sep2)

{
  undefined8 uVar1;
  char *pcVar2;
  String *this_00;
  int *in_RCX;
  uint j;
  char *__haystack;
  int *__needle;
  long lVar3;
  long lVar4;
  Array<asl::String> pairs;
  undefined1 local_70 [24];
  void *local_58;
  String local_48;
  
  local_70._8_8_ = this;
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)this,0);
  split((String *)local_70,sep1);
  if (0 < *(int *)&((String *)(local_70._0_8_ + -0x18))->field_2) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      uVar1 = local_70._0_8_;
      __needle = in_RCX + 2;
      if (*in_RCX != 0) {
        __needle = *(int **)(in_RCX + 2);
      }
      if (*(int *)((long)(int *)local_70._0_8_ + lVar4) == 0) {
        __haystack = ((anon_union_16_2_78e7fdac_for_String_2 *)(local_70._0_8_ + 8))->_space + lVar4
        ;
      }
      else {
        __haystack = *(char **)((long)(local_70._0_8_ + 8) + lVar4);
      }
      pcVar2 = strstr(__haystack,(char *)__needle);
      j = -(uint)(pcVar2 == (char *)0x0) | (int)pcVar2 - (int)__haystack;
      if (0 < (int)j) {
        substring((String *)(local_70 + 0x10),(String *)((long)(int *)uVar1 + lVar4),in_RCX[1] + j,
                  *(int *)((long)(uVar1 + 4) + lVar4));
        substring(&local_48,(String *)((long)(int *)local_70._0_8_ + lVar4),0,j);
        this_00 = Map<asl::String,_asl::String>::operator[]
                            ((Map<asl::String,_asl::String> *)local_70._8_8_,&local_48);
        operator=(this_00,(String *)(local_70 + 0x10));
        if (local_48._size != 0) {
          ::free(local_48.field_2._str);
        }
        if (local_70._16_4_ != 0) {
          ::free(local_58);
        }
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar3 < *(int *)&((String *)(local_70._0_8_ + -0x18))->field_2);
  }
  Array<asl::String>::~Array((Array<asl::String> *)local_70);
  return (Dic<asl::String>)(KeyVal *)local_70._8_8_;
}

Assistant:

Dic<String> String::split(const String& sep1, const String& sep2) const
{
	Dic<String> dic;
	Array<String> pairs = split(sep1);
	for (int i = 0; i < pairs.length(); i++)
	{
		int j = pairs[i].indexOf(sep2);
		if (j > 0)
			dic[pairs[i].substring(0, j)] = pairs[i].substring(j + sep2.length());
	}
	return dic;
}